

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O1

Expression * __thiscall
soul::ResolutionPass::OperatorResolver::visit(OperatorResolver *this,WriteToEndpoint *w)

{
  size_t *psVar1;
  Expression *pEVar2;
  Allocator *allocator;
  EndpointDeclaration *endpoint;
  bool bVar3;
  int iVar4;
  WriteToEndpoint *pWVar5;
  long lVar6;
  string_view other;
  Type TStack_38;
  
  RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,&w->target);
  RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,&w->value);
  iVar4 = (*(w->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])(w);
  if ((char)iVar4 == '\0') {
    psVar1 = &(this->super_ErrorIgnoringRewritingASTVisitor).numFails;
    *psVar1 = *psVar1 + 1;
  }
  else {
    pWVar5 = ASTUtilities::getTopLevelWriteToEndpoint(w);
    pEVar2 = (pWVar5->target).object;
    if (pEVar2 == (Expression *)0x0) {
      lVar6 = 0;
    }
    else {
      lVar6 = __dynamic_cast(pEVar2,&AST::Expression::typeinfo,&AST::OutputEndpointRef::typeinfo,0);
    }
    if ((lVar6 != 0) && (*(char *)(*(long *)(lVar6 + 0x30) + 0x60) == '\x01')) {
      other._M_str = "_console";
      other._M_len = 8;
      bVar3 = Identifier::operator==((Identifier *)(*(long *)(lVar6 + 0x30) + 0x30),other);
      if (bVar3) {
        allocator = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
        endpoint = *(EndpointDeclaration **)(lVar6 + 0x30);
        (*(((w->value).object)->super_Statement).super_ASTObject._vptr_ASTObject[4])(&TStack_38);
        ASTUtilities::ensureEventEndpointSupportsType(allocator,endpoint,&TStack_38);
        RefCountedPtr<soul::Structure>::decIfNotNull(TStack_38.structure.object);
      }
    }
  }
  return &w->super_Expression;
}

Assistant:

AST::Expression& visit (AST::WriteToEndpoint& w) override
        {
            super::visit (w);

            if (! w.isResolved())
            {
                ++numFails;
                return w;
            }

            auto& topLevelWrite = ASTUtilities::getTopLevelWriteToEndpoint (w);

            // Either an OutputEndpointRef, or an ArrayElementRef of an OutputEndpointRef
            if (auto outputEndpoint = cast<AST::OutputEndpointRef> (topLevelWrite.target))
                if (ASTUtilities::isConsoleEndpoint (outputEndpoint->output))
                    ASTUtilities::ensureEventEndpointSupportsType (allocator, outputEndpoint->output, w.value->getResultType());

            return w;
        }